

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorConicGradient::ReleaseElementData
          (DecoratorConicGradient *this,DecoratorDataHandle handle)

{
  Pool<Rml::ShaderElementData> *this_00;
  
  this_00 = GetShaderElementDataPool();
  Pool<Rml::ShaderElementData>::DestroyAndDeallocate(this_00,(ShaderElementData *)handle);
  return;
}

Assistant:

void DecoratorConicGradient::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}